

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool __thiscall
Fossilize::ZipDatabase::write_entry
          (ZipDatabase *this,ResourceTag tag,Hash hash,void *blob,size_t size,
          PayloadWriteFlags flags)

{
  size_t sVar1;
  bool bVar2;
  mz_bool mVar3;
  LogLevel LVar4;
  iterator iVar5;
  bool bVar6;
  char str [41];
  Hash local_90;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_88;
  size_t local_80;
  undefined4 local_78;
  size_t local_70;
  char local_68 [24];
  char local_50 [32];
  
  if ((flags & 1) == 0) {
    bVar6 = false;
    if ((this->alive == true) && (bVar6 = false, this->mode != ReadOnly)) {
      local_90 = hash;
      local_80 = size;
      iVar5 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this->seen_blobs[tag]._M_h,&local_90);
      bVar6 = true;
      if (iVar5.
          super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false>
          ._M_cur == (__node_type *)0x0) {
        local_88 = &this->seen_blobs[tag]._M_h;
        sprintf(local_68,"%0*x",0x18,tag);
        sprintf(local_50,"%016lx",local_90);
        sVar1 = local_80;
        mVar3 = mz_zip_writer_add_mem
                          (&this->mz,local_68,blob,local_80,
                           (flags & 4) * 2 + 1 & (int)(flags << 0x1e) >> 0x1f);
        bVar6 = mVar3 != 0;
        if (mVar3 == 0) {
          LVar4 = get_thread_log_level();
          if ((int)LVar4 < 3) {
            bVar2 = Internal::log_thread_callback(LOG_ERROR,"Failed to add blob to cache.\n");
            if (!bVar2) {
              write_entry();
            }
          }
        }
        else {
          bVar2 = DatabaseInterface::test_resource_filter
                            (&this->super_DatabaseInterface,tag,local_90);
          if (bVar2) {
            local_78 = 0xffffffff;
            local_70 = sVar1;
            std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<unsigned_long&,Fossilize::ZipDatabase::Entry>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_88,&local_90);
          }
        }
      }
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool write_entry(ResourceTag tag, Hash hash, const void *blob, size_t size, PayloadWriteFlags flags) override
	{
		if ((flags & PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT) != 0)
			return false;

		if (!alive || mode == DatabaseMode::ReadOnly)
			return false;

		auto itr = seen_blobs[tag].find(hash);
		if (itr != end(seen_blobs[tag]))
			return true;

		char str[FOSSILIZE_BLOB_HASH_LENGTH + 1]; // 40 digits + null
		sprintf(str, "%0*x", FOSSILIZE_BLOB_HASH_LENGTH - 16, tag);
		sprintf(str + FOSSILIZE_BLOB_HASH_LENGTH - 16, "%016" PRIx64, hash);

		unsigned mz_flags;
		if ((flags & PAYLOAD_WRITE_COMPRESS_BIT) != 0)
		{
			if ((flags & PAYLOAD_WRITE_BEST_COMPRESSION_BIT) != 0)
				mz_flags = MZ_BEST_COMPRESSION;
			else
				mz_flags = MZ_BEST_SPEED;
		}
		else
			mz_flags = MZ_NO_COMPRESSION;

		if (!mz_zip_writer_add_mem(&mz, str, blob, size, mz_flags))
		{
			LOGE_LEVEL("Failed to add blob to cache.\n");
			return false;
		}

		// The index is irrelevant, we're not going to read from this archive any time soon.
		if (test_resource_filter(static_cast<ResourceTag>(tag), hash))
			seen_blobs[tag].emplace(hash, Entry{~0u, size});
		return true;
	}